

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_helper.h
# Opt level: O0

void printXYAsMathematicaList<long_double>
               (vector<long_double,_std::allocator<long_double>_> *values)

{
  size_type nSamples;
  ostream *poVar1;
  const_reference pvVar2;
  double dVar3;
  size_type local_20;
  long i;
  long L;
  vector<long_double,_std::allocator<long_double>_> *values_local;
  
  nSamples = std::vector<long_double,_std::allocator<long_double>_>::size(values);
  std::operator<<((ostream *)&std::cout,"{");
  for (local_20 = 0; (long)local_20 < (long)nSamples; local_20 = local_20 + 1) {
    if (0 < (long)local_20) {
      std::operator<<((ostream *)&std::cout,",");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"{");
    dVar3 = alphaForIndex<double>(local_20,nSamples);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
    poVar1 = std::operator<<(poVar1,",");
    pvVar2 = std::vector<long_double,_std::allocator<long_double>_>::operator[](values,local_20);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(longdouble *)pvVar2);
    std::operator<<(poVar1,"}");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printXYAsMathematicaList(const vector<Num> &values) {
	long L = values.size();
	cout << "{";
	for (long i = 0; i < L; ++i) {
		if (i > 0) cout << ",";
		cout << "{" << alphaForIndex<double>(i, L) << "," << values[i] << "}";
	}
	cout << "}" << endl;
}